

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall wasm::DataFlow::Graph::build(Graph *this,Function *funcInit,Module *moduleInit)

{
  bool bVar1;
  size_t sVar2;
  size_t __new_size;
  Type TVar3;
  Node *pNVar4;
  Index i;
  Index index;
  ulong uVar5;
  
  this->func = funcInit;
  this->module = moduleInit;
  sVar2 = Function::getNumLocals(funcInit);
  if (sVar2 != 0) {
    __new_size = Function::getNumLocals(this->func);
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::resize
              (&this->locals,__new_size);
    uVar5 = 0;
    do {
      index = (Index)uVar5;
      TVar3 = Function::getLocalType(this->func,index);
      if ((TVar3.id & 0xfffffffffffffffe) == 2) {
        TVar3 = Function::getLocalType(this->func,index);
        bVar1 = Function::isParam(this->func,index);
        if (bVar1) {
          pNVar4 = makeVar(this,TVar3);
        }
        else {
          pNVar4 = makeZero(this,TVar3);
        }
        (this->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] = pNVar4;
      }
      uVar5 = (ulong)(index + 1);
    } while (uVar5 < sVar2);
    Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
              ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,this->func->body);
    return;
  }
  return;
}

Assistant:

void build(Function* funcInit, Module* moduleInit) {
    func = funcInit;
    module = moduleInit;

    auto numLocals = func->getNumLocals();
    if (numLocals == 0) {
      return; // nothing to do
    }
    // Set up initial local state IR.
    setInReachable();
    for (Index i = 0; i < numLocals; i++) {
      if (!isRelevantType(func->getLocalType(i))) {
        continue;
      }
      Node* node;
      auto type = func->getLocalType(i);
      if (func->isParam(i)) {
        node = makeVar(type);
      } else {
        node = makeZero(type);
      }
      locals[i] = node;
    }
    // Process the function body, generating the rest of the IR.
    visit(func->body);
  }